

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_3_2::ThreadPool::addTask(ThreadPool *this,Task *task)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  Data *in_RDI;
  ProviderPtr p;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  __shared_ptr local_20 [16];
  long local_10;
  
  if (in_RSI != 0) {
    local_10 = in_RSI;
    Data::getProvider(in_RDI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x107edf);
      (*peVar2->_vptr_ThreadPoolProvider[4])(peVar2,local_10);
    }
    else {
      anon_unknown_5::handleProcessTask
                ((Task *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    std::shared_ptr<IlmThread_3_2::ThreadPoolProvider>::~shared_ptr
              ((shared_ptr<IlmThread_3_2::ThreadPoolProvider> *)0x107f34);
  }
  return;
}

Assistant:

void
ThreadPool::addTask (Task* task)
{
    if (task)
    {
#ifdef ENABLE_THREADING
        Data::ProviderPtr p = _data->getProvider ();
        if (p)
        {
            p->addTask (task);
            return;
        }
#endif

        handleProcessTask (task);
    }
}